

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

char * luaL_prepbuffsize(luaL_Buffer *B,size_t sz)

{
  lua_State *L;
  ulong uVar1;
  char *__dest;
  ulong uVar2;
  ulong size;
  
  uVar2 = B->n;
  if (B->size - uVar2 < sz) {
    uVar1 = B->size * 2;
    size = uVar2 + sz;
    if (sz <= uVar1 - uVar2) {
      size = uVar1;
    }
    L = B->L;
    if (!(bool)(~(size < uVar2) & sz <= size - uVar2)) {
      luaL_error(L,"buffer too large");
    }
    __dest = (char *)lua_newuserdata(L,size);
    memcpy(__dest,B->b,B->n);
    if (B->b != B->initb) {
      lua_remove(L,-2);
    }
    B->b = __dest;
    B->size = size;
    uVar2 = B->n;
  }
  else {
    __dest = B->b;
  }
  return __dest + uVar2;
}

Assistant:

LUALIB_API char *luaL_prepbuffsize (luaL_Buffer *B, size_t sz) {
  lua_State *L = B->L;
  if (B->size - B->n < sz) {  /* not enough space? */
    char *newbuff;
    size_t newsize = B->size * 2;  /* double buffer size */
    if (newsize - B->n < sz)  /* not big enough? */
      newsize = B->n + sz;
    if (newsize < B->n || newsize - B->n < sz)
      luaL_error(L, "buffer too large");
    /* create larger buffer */
    newbuff = (char *)lua_newuserdata(L, newsize * sizeof(char));
    /* move content to new buffer */
    memcpy(newbuff, B->b, B->n * sizeof(char));
    if (buffonstack(B))
      lua_remove(L, -2);  /* remove old buffer */
    B->b = newbuff;
    B->size = newsize;
  }
  return &B->b[B->n];
}